

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pz81.hpp
# Opt level: O2

void ExchCXX::kernel_traits<ExchCXX::BuiltinPZ81>::eval_exc_polar_impl
               (double rho_a,double rho_b,double *eps)

{
  double dVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 local_88;
  
  dVar3 = cbrt(rho_a + rho_b);
  dVar1 = (1.0 / dVar3) * 2.519842099789747;
  dVar4 = dVar1 * 0.9847450218426962;
  if (dVar4 < 0.0) {
    dVar5 = sqrt(dVar4);
  }
  else {
    dVar5 = SQRT(dVar4);
  }
  dVar6 = log(dVar4 * 0.25);
  dVar1 = dVar6 * dVar1;
  dVar3 = (1.0 / dVar3) * 1.720508027656199;
  auVar9._8_8_ = dVar3 * 0.4808460067404899 * 0.25 + dVar5 * 1.0529 * 0.5 + 1.0;
  auVar9._0_8_ = dVar3 * 0.37657136280726433 * 0.25 + dVar5 * 1.3981 * 0.5 + 1.0;
  auVar9 = divpd(_DAT_010028a0,auVar9);
  uVar2 = (uint)(1.0 <= dVar4 * 0.25);
  auVar7._0_8_ = CONCAT44((int)(uVar2 << 0x1f) >> 0x1f,(int)(uVar2 << 0x1f) >> 0x1f);
  auVar7._8_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
  auVar7._12_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
  auVar10._0_8_ = auVar9._0_8_ & auVar7._0_8_;
  auVar10._8_8_ = auVar9._8_8_ & auVar7._8_8_;
  auVar8._0_8_ = ~auVar7._0_8_ &
                 (ulong)((dVar1 * 0.0006893215152898874 * 0.25 + dVar6 * 0.01555 + -0.0269) -
                        dVar3 * 0.0069227979374755595 * 0.25);
  auVar8._8_8_ = ~auVar7._8_8_ &
                 (ulong)((dVar1 * 0.0019694900436853925 * 0.25 + dVar6 * 0.0311 + -0.048) -
                        dVar3 * 0.016730095015565934 * 0.25);
  dVar1 = SUB168(auVar8 | auVar10,8);
  dVar5 = (1.0 / (rho_a + rho_b)) * (rho_a - rho_b);
  dVar6 = dVar5 + 1.0;
  dVar3 = cbrt(1e-15);
  dVar4 = cbrt(dVar6);
  local_88 = (double)(-(ulong)(dVar6 <= 1e-15) & (ulong)(dVar3 * 1e-15) |
                     ~-(ulong)(dVar6 <= 1e-15) & (ulong)(dVar4 * dVar6));
  dVar5 = 1.0 - dVar5;
  dVar4 = cbrt(dVar5);
  *eps = ((double)(-(ulong)(dVar5 <= 1e-15) & (ulong)(dVar3 * 1e-15) |
                  ~-(ulong)(dVar5 <= 1e-15) & (ulong)(dVar4 * dVar5)) + local_88 + -2.0) *
         (SUB168(auVar8 | auVar10,0) - dVar1) * 1.9236610509315362 + dVar1;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double& eps ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t87 = constants::m_cbrt_2;
    constexpr double t6 = t5 * t5;
    constexpr double t14 = gamma_0;
    constexpr double t15 = beta1_0;
    constexpr double t20 = beta2_0 * t1;
    constexpr double t21 = t3 * t6;
    constexpr double t28 = a_0;
    constexpr double t33 = c_0 * t1;
    constexpr double t34 = t33 * t3;
    constexpr double t39 = d_0 * t1;
    constexpr double t44 = gamma_1;
    constexpr double t45 = beta1_1;
    constexpr double t49 = beta2_1 * t1;
    constexpr double t55 = a_1;
    constexpr double t59 = c_1 * t1;
    constexpr double t60 = t59 * t3;
    constexpr double t64 = d_1 * t1;


    const double t7 = rho_a + rho_b;
    const double t8 = safe_math::cbrt( t7 );
    const double t9 = 0.1e1 / t8;
    const double t10 = t6 * t9;
    const double t11 = t1 * t3 * t10;
    const double t12 = t11 / 0.4e1;
    const double t13 = 0.1e1 <= t12;
    const double t16 = safe_math::sqrt( t11 );
    const double t22 = t21 * t9;
    const double t25 = 0.1e1 + t15 * t16 / 0.2e1 + t20 * t22 / 0.4e1;
    const double t29 = safe_math::log( t12 );
    const double t35 = t10 * t29;
    const double t43 = piecewise_functor_3( t13, t14 / t25, t28 * t29 + b_0 + t34 * t35 / 0.4e1 + t39 * t22 / 0.4e1 );
    const double t52 = 0.1e1 + t45 * t16 / 0.2e1 + t49 * t22 / 0.4e1;
    const double t68 = piecewise_functor_3( t13, t44 / t52, t55 * t29 + b_1 + t60 * t35 / 0.4e1 + t64 * t22 / 0.4e1 );
    const double t69 = t68 - t43;
    const double t70 = rho_a - rho_b;
    const double t71 = 0.1e1 / t7;
    const double t72 = t70 * t71;
    const double t73 = 0.1e1 + t72;
    const double t74 = t73 <= zeta_tol;
    const double t75 = safe_math::cbrt( zeta_tol );
    const double t76 = t75 * zeta_tol;
    const double t77 = safe_math::cbrt( t73 );
    const double t79 = piecewise_functor_3( t74, t76, t77 * t73 );
    const double t80 = 0.1e1 - t72;
    const double t81 = t80 <= zeta_tol;
    const double t82 = safe_math::cbrt( t80 );
    const double t84 = piecewise_functor_3( t81, t76, t82 * t80 );
    const double t85 = t79 + t84 - 0.2e1;
    const double t90 = 0.1e1 / ( 0.2e1 * t87 - 0.2e1 );
    const double t91 = t69 * t85 * t90;


    eps = t43 + t91;

  }